

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O3

void __thiscall
tiger::trains::ai::PathCalculator::calculate(PathCalculator *this,LineBlocker *blocker)

{
  int iVar1;
  Line *line;
  _Base_ptr p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *pvVar6;
  mapped_type *pmVar7;
  mapped_type *ppPVar8;
  pointer ppLVar9;
  pointer ppLVar10;
  LineBlock lineBlock;
  pair<std::_Rb_tree_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::_Rb_tree_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  pVar11;
  Point *another;
  Point *minPoint;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  setMinLen;
  Point *local_98;
  _Base_ptr local_90;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  *local_88;
  key_type local_80;
  map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
  *local_70;
  pointer local_68;
  _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  startInit(this,blocker,
            (set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
             *)&local_60);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_88 = &this->minLen;
    local_70 = &this->ancestors;
    do {
      local_90 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      std::
      _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                          *)&local_60,
                         (const_iterator)local_60._M_impl.super__Rb_tree_header._M_header._M_left);
      pvVar6 = world::Point::getEdges((Point *)local_90);
      ppLVar9 = (pvVar6->
                super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppLVar10 = (pvVar6->
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      local_68 = ppLVar10;
      if (ppLVar9 != ppLVar10) {
        do {
          line = *ppLVar9;
          lineBlock.inPoint = (Point *)local_90;
          lineBlock.line = line;
          bVar3 = LineBlocker::contain(blocker,lineBlock);
          if ((!bVar3) &&
             (bVar3 = BotSharedData::canMove(this->sharedData,(Point *)local_90,line), bVar3)) {
            local_98 = world::Line::getAnotherPoint(line,(Point *)local_90);
            pmVar7 = std::
                     map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                     ::operator[](local_88,&local_98);
            iVar1 = *pmVar7;
            pmVar7 = std::
                     map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                     ::operator[](local_88,(key_type *)&local_90);
            iVar5 = *pmVar7;
            iVar4 = world::Line::getLenght(line);
            ppLVar10 = local_68;
            if (iVar4 + iVar5 < iVar1) {
              pmVar7 = std::
                       map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                       ::operator[](local_88,&local_98);
              local_80.first = *pmVar7;
              local_80.second = local_98;
              pVar11 = std::
                       _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                       ::equal_range(&local_60,&local_80);
              std::
              _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
              ::_M_erase_aux(&local_60,(_Base_ptr)pVar11.first._M_node,
                             (_Base_ptr)pVar11.second._M_node);
              pmVar7 = std::
                       map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                       ::operator[](local_88,(key_type *)&local_90);
              iVar1 = *pmVar7;
              iVar5 = world::Line::getLenght(line);
              pmVar7 = std::
                       map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                       ::operator[](local_88,&local_98);
              p_Var2 = local_90;
              *pmVar7 = iVar5 + iVar1;
              ppPVar8 = std::
                        map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                        ::operator[](local_70,&local_98);
              *ppPVar8 = (mapped_type)p_Var2;
              pmVar7 = std::
                       map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                       ::operator[](local_88,&local_98);
              local_80.first = *pmVar7;
              local_80.second = local_98;
              std::
              _Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
              ::_M_insert_unique<std::pair<int,tiger::trains::world::Point_const*>>
                        ((_Rb_tree<std::pair<int,tiger::trains::world::Point_const*>,std::pair<int,tiger::trains::world::Point_const*>,std::_Identity<std::pair<int,tiger::trains::world::Point_const*>>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                          *)&local_60,&local_80);
              ppLVar10 = local_68;
            }
          }
          ppLVar9 = ppLVar9 + 1;
        } while (ppLVar9 != ppLVar10);
      }
    } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  std::
  _Rb_tree<std::pair<int,_const_tiger::trains::world::Point_*>,_std::pair<int,_const_tiger::trains::world::Point_*>,_std::_Identity<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void PathCalculator::calculate(LineBlocker &blocker)
{

    std::set< std::pair<int, const world::Point *>> setMinLen;

    startInit(blocker, setMinLen);

    while (!setMinLen.empty())
    {
        auto minPoint = setMinLen.begin()->second;
        setMinLen.erase(setMinLen.begin());

        for (auto line : minPoint->getEdges())
        {
            if (blocker.contain({line, minPoint}) || !sharedData->canMove(minPoint, line))
                continue;

            const world::Point *another = line->getAnotherPoint(minPoint);

            if (minLen[another] > minLen[minPoint] + line->getLenght())
            {
                setMinLen.erase({minLen[another], another});
                minLen[another] = minLen[minPoint] + line->getLenght();
                ancestors[another] = minPoint;
                setMinLen.insert({minLen[another], another});
            }
        }

    }

}